

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

void __thiscall
Kernel::InferenceStore::outputUnsatCore(InferenceStore *this,ostream *out,Unit *refutation)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  Unit *pUVar4;
  Formula *pFVar5;
  UnitIterator parents;
  Set<Kernel::Unit_*,_Lib::DefaultHash> visited;
  Stack<Kernel::Unit_*> local_98;
  long *local_78 [4];
  Set<Kernel::Unit_*,_Lib::DefaultHash> local_58;
  
  poVar3 = std::operator<<(out,"(");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_98._cursor = (Unit **)0x0;
  local_98._end = (Unit **)0x0;
  local_98._capacity = 0;
  local_98._stack = (Unit **)0x0;
  Lib::Stack<Kernel::Unit_*>::push(&local_98,refutation);
  Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::Set(&local_58);
LAB_0042bc6c:
  do {
    while( true ) {
      if (local_98._cursor == local_98._stack) {
        poVar3 = std::operator<<(out,")");
        std::endl<char,std::char_traits<char>>(poVar3);
        Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::~Set(&local_58);
        Lib::Stack<Kernel::Unit_*>::~Stack(&local_98);
        return;
      }
      pUVar4 = local_98._cursor[-1];
      local_98._cursor = local_98._cursor + -1;
      Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::insert(&local_58,pUVar4);
      if ((pUVar4->_inference).field_0x1 == '\0') break;
      Unit::getParents((Unit *)local_78);
      while( true ) {
        cVar1 = (**(code **)(*local_78[0] + 0x10))();
        if (cVar1 == '\0') break;
        pUVar4 = (Unit *)(**(code **)(*local_78[0] + 0x18))();
        bVar2 = Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::contains(&local_58,pUVar4);
        if (!bVar2) {
          Lib::Stack<Kernel::Unit_*>::push(&local_98,pUVar4);
        }
      }
      Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator
                ((VirtualIterator<Kernel::Unit_*> *)local_78);
    }
  } while ((pUVar4->field_0x4 & 1) == 0);
  pFVar5 = Unit::getFormula(pUVar4);
  bVar2 = Formula::hasLabel(pFVar5);
  if (!bVar2) goto LAB_0042bd3d;
  pFVar5 = Unit::getFormula(pUVar4);
  std::__cxx11::string::string((string *)local_78,(string *)&pFVar5->_label);
  poVar3 = std::operator<<(out,(string *)local_78);
  std::endl<char,std::char_traits<char>>(poVar3);
  goto LAB_0042bd30;
LAB_0042bd3d:
  if (*(char *)(Lib::env + 0xd35a) == '\0') {
    pFVar5 = Unit::getFormula(pUVar4);
    bVar2 = Formula::hasLabel(pFVar5);
    if (!bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "ERROR: There is a problem with the unsat core. There is an input formula in the proof"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "that does not have a label. We expect all  input formulas to have labels as this  is what"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "smtcomp does. If you don\'t want this then use the ignore_missing_inputs_in_unsat_core option"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"The unlabelled  input formula is ");
      std::endl<char,std::char_traits<char>>(poVar3);
      Unit::toString_abi_cxx11_((string *)local_78,pUVar4);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_78);
      std::endl<char,std::char_traits<char>>(poVar3);
LAB_0042bd30:
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  goto LAB_0042bc6c;
}

Assistant:

void InferenceStore::outputUnsatCore(std::ostream& out, Unit* refutation)
{
  out << "(" << endl;

  Stack<Unit*> todo;
  todo.push(refutation);
  Set<Unit*> visited;
  while(!todo.isEmpty()){

    Unit* u = todo.pop();
    visited.insert(u);

    if(u->inference().rule() ==  InferenceRule::INPUT){
      if(!u->isClause()){
        if(u->getFormula()->hasLabel()){
          std::string label =  u->getFormula()->getLabel();
          out << label << endl;
        }
        else{
          ASS(env.options->ignoreMissingInputsInUnsatCore() || u->getFormula()->hasLabel());
          if(!(env.options->ignoreMissingInputsInUnsatCore() || u->getFormula()->hasLabel())){
            cout << "ERROR: There is a problem with the unsat core. There is an input formula in the proof" <<  endl;
            cout << "that does not have a label. We expect all  input formulas to have labels as this  is what" << endl;
            cout << "smtcomp does. If you don't want this then use the ignore_missing_inputs_in_unsat_core option" << endl;
            cout << "The unlabelled  input formula is " << endl;
            cout << u->toString() << endl;
          }
        }
      }
      else{
        //Currently ignore clauses as they cannot come from SMT-LIB as input formulas
      }
    }
    else{
      UnitIterator parents = u->getParents();
      while(parents.hasNext()){
        Unit* parent = parents.next();
        if(!visited.contains(parent)){
          todo.push(parent);
        }
      }
    }
  }

  out << ")" << endl;
}